

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O0

int __thiscall simple_thread_pool::ThreadPoolMgr::init(ThreadPoolMgr *this,EVP_PKEY_CTX *ctx)

{
  undefined2 uVar1;
  size_t sVar2;
  int extraout_EAX;
  element_type *this_00;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_false,_false>,_bool>
  pVar3;
  shared_ptr<simple_thread_pool::ThreadHandle> t_handle;
  size_t ii;
  lock_guard<std::mutex> l;
  ThreadHandle *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_false>
  in_stack_ffffffffffffff48;
  unordered_map<unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>_>_>
  *this_01;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_false>
  in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff79;
  ThreadHandle *in_stack_ffffffffffffff80;
  element_type *local_58;
  ThreadPoolMgr *local_38;
  code *local_30;
  undefined8 local_28;
  undefined8 local_10;
  undefined8 local_8;
  
  uVar1 = *(undefined2 *)(ctx + 0x10);
  (this->myOpt).invokeCanceledTask = (bool)(char)uVar1;
  (this->myOpt).activeWorkerMode = (bool)(char)((ushort)uVar1 >> 8);
  sVar2 = *(size_t *)(ctx + 8);
  (this->myOpt).numInitialThreads = *(size_t *)ctx;
  (this->myOpt).busyWaitingIntervalUs = sVar2;
  local_10 = ctx;
  local_8 = this;
  std::atomic<bool>::operator=
            ((atomic<bool> *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
             SUB81((ulong)in_stack_ffffffffffffff38 >> 0x38,0));
  operator_new(8);
  local_30 = loop;
  local_28 = 0;
  local_38 = this;
  std::thread::
  thread<void(simple_thread_pool::ThreadPoolMgr::*)(),simple_thread_pool::ThreadPoolMgr*,void>
            ((thread *)in_stack_ffffffffffffff80,
             (type *)CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78),
             (ThreadPoolMgr **)in_stack_ffffffffffffff70._M_cur);
  std::shared_ptr<std::thread>::shared_ptr<std::thread,void>
            ((shared_ptr<std::thread> *)
             CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
             (thread *)in_stack_ffffffffffffff38);
  std::shared_ptr<std::thread>::operator=
            ((shared_ptr<std::thread> *)
             CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
             (shared_ptr<std::thread> *)in_stack_ffffffffffffff38);
  std::shared_ptr<std::thread>::~shared_ptr((shared_ptr<std::thread> *)0x109662);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40)
             ,(mutex_type *)in_stack_ffffffffffffff38);
  for (local_58 = (element_type *)0x0; local_58 < (element_type *)(this->myOpt).numInitialThreads;
      local_58 = (element_type *)((long)&local_58->myId + 1)) {
    operator_new(200);
    ThreadHandle::ThreadHandle
              (in_stack_ffffffffffffff80,
               (ThreadPoolMgrBase *)CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78),
               (size_t)in_stack_ffffffffffffff70._M_cur);
    std::shared_ptr<simple_thread_pool::ThreadHandle>::
    shared_ptr<simple_thread_pool::ThreadHandle,void>
              ((shared_ptr<simple_thread_pool::ThreadHandle> *)
               CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38);
    this_01 = &this->idleThreads;
    std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>::
    pair<unsigned_long_&,_std::shared_ptr<simple_thread_pool::ThreadHandle>_&,_true>
              ((pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_> *)
               CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
               &in_stack_ffffffffffffff38->myId,
               (shared_ptr<simple_thread_pool::ThreadHandle> *)0x1096f1);
    pVar3 = std::
            unordered_map<unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>_>_>
            ::insert(this_01,(value_type *)in_stack_ffffffffffffff48._M_cur);
    in_stack_ffffffffffffff48._M_cur =
         (__node_type *)
         pVar3.first.
         super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_false>
         ._M_cur;
    in_stack_ffffffffffffff47 = pVar3.second;
    in_stack_ffffffffffffff70._M_cur = in_stack_ffffffffffffff48._M_cur;
    in_stack_ffffffffffffff78 = in_stack_ffffffffffffff47;
    std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>::~pair
              ((pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_> *)
               0x109729);
    in_stack_ffffffffffffff38 = (ThreadHandle *)&stack0xffffffffffffff98;
    this_00 = std::
              __shared_ptr_access<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x109737);
    ThreadHandle::init(this_00,(EVP_PKEY_CTX *)in_stack_ffffffffffffff38);
    std::shared_ptr<simple_thread_pool::ThreadHandle>::~shared_ptr
              ((shared_ptr<simple_thread_pool::ThreadHandle> *)0x10974f);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x109805);
  return extraout_EAX;
}

Assistant:

void init(const ThreadPoolOptions& opt) {
        myOpt = opt;
        stopSignal = false;

        loopThread = std::shared_ptr<std::thread>
                     ( new std::thread( &ThreadPoolMgr::loop, this ) );

        {   std::lock_guard<std::mutex> l(idleThreadsLock);
            for (size_t ii = 0; ii < myOpt.numInitialThreads; ++ii) {
                std::shared_ptr<ThreadHandle> t_handle( new ThreadHandle(this, ii) );
                idleThreads.insert({ii, t_handle});
                t_handle->init(t_handle);
            }
        }
    }